

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  int *__s;
  int *__s_00;
  unsigned_short *puVar13;
  unsigned_short *puVar14;
  int *__s_01;
  unsigned_short *puVar15;
  uchar *puVar16;
  uint *puVar17;
  uint *puVar18;
  uint *frequencies;
  void *__dest;
  void *__ptr;
  unsigned_short uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  size_t sVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  size_t sVar32;
  long lVar33;
  size_t sVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint *puVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar42 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  LodePNGBitWriter local_1f8;
  uivector lz77_encoded;
  ucvector v;
  HuffmanTree tree_ll;
  undefined1 local_128 [48];
  HuffmanTree tree_d;
  Hash hash;
  undefined1 auVar48 [32];
  
  auVar42 = in_ZMM6._0_32_;
  auVar40 = in_ZMM5._0_16_;
  v.data = *out;
  v.size = *outsize;
  local_1f8.data = &v;
  local_1f8.bp = '\0';
  uVar25 = settings->btype;
  uVar12 = 0x3d;
  if (uVar25 < 3) {
    sVar32 = insize;
    v.allocsize = v.size;
    if (uVar25 != 1) {
      if (uVar25 == 0) {
        if (0xfffe < insize + 0xfffe) {
          uVar38 = (insize + 0xfffe) / 0xffff;
          uVar25 = 0;
          do {
            sVar32 = v.size;
            uVar12 = (int)insize - uVar25;
            if (0xfffe < insize - uVar25) {
              uVar12 = 0xffff;
            }
            uVar26 = (ulong)uVar12;
            uVar36 = uVar26 + v.size + 5;
            puVar16 = v.data;
            sVar34 = v.allocsize;
            if (v.allocsize < uVar36) {
              sVar34 = (v.allocsize >> 1) + uVar36;
              puVar16 = (uchar *)realloc(v.data,sVar34);
              if (puVar16 != (uchar *)0x0) goto LAB_00128470;
              bVar8 = true;
            }
            else {
LAB_00128470:
              v.allocsize = sVar34;
              v.data = puVar16;
              bVar8 = false;
              v.size = uVar36;
            }
            if (!bVar8) {
              v.data[sVar32] = uVar38 == 1;
              v.data[sVar32 + 1] = (uchar)uVar12;
              v.data[sVar32 + 2] = (uchar)(uVar12 >> 8);
              v.data[sVar32 + 3] = (uchar)(0xffff - uVar12);
              v.data[sVar32 + 4] = (uchar)(0xffff - uVar12 >> 8);
              if (uVar26 != 0) {
                memcpy(v.data + sVar32 + 5,in + uVar25,uVar26);
              }
              uVar25 = uVar12 + uVar25;
            }
            if (bVar8) {
              uVar12 = 0x53;
              goto LAB_001290c0;
            }
            uVar38 = uVar38 - 1;
          } while (uVar38 != 0);
        }
        uVar12 = 0;
        goto LAB_001290c0;
      }
      uVar38 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar38 = insize >> 3;
      }
      if (0x3fff7 < uVar38) {
        uVar38 = 0x3fff8;
      }
      sVar32 = uVar38 + 8;
    }
    uVar38 = 1;
    if (!CARRY8(insize - 1,sVar32)) {
      uVar38 = ((insize - 1) + sVar32) / sVar32;
    }
    uVar26 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    hash.head = __s;
    __s_00 = (int *)malloc(uVar26 * 4);
    sVar28 = uVar26 * 2;
    hash.val = __s_00;
    puVar13 = (unsigned_short *)malloc(sVar28);
    hash.chain = puVar13;
    puVar14 = (unsigned_short *)malloc(sVar28);
    hash.zeros = puVar14;
    __s_01 = (int *)malloc(0x40c);
    hash.headz = __s_01;
    puVar15 = (unsigned_short *)malloc(sVar28);
    uVar12 = 0x53;
    hash.chainz = puVar15;
    if (__s_00 == (int *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = false;
      if ((((__s != (int *)0x0) && (puVar13 != (unsigned_short *)0x0)) &&
          (bVar8 = false, puVar14 != (unsigned_short *)0x0)) &&
         ((__s_01 != (int *)0x0 && (puVar15 != (unsigned_short *)0x0)))) {
        memset(__s,0xff,0x40000);
        if (uVar26 == 0) {
          memset(__s_01,0xff,0x40c);
        }
        else {
          memset(__s_00,0xff,uVar26 * 4);
          lVar27 = uVar26 - 1;
          auVar47._8_8_ = lVar27;
          auVar47._0_8_ = lVar27;
          auVar48._16_8_ = lVar27;
          auVar48._0_16_ = auVar47;
          auVar48._24_8_ = lVar27;
          auVar41 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
          auVar4 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
          auVar5 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar6 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          uVar36 = 0;
          auVar49._8_8_ = 0x8000000000000000;
          auVar49._0_8_ = 0x8000000000000000;
          auVar43 = auVar47 ^ auVar49;
          auVar40 = vpcmpeqd_avx(auVar40,auVar40);
          auVar50._8_8_ = 0x8000000000000000;
          auVar50._0_8_ = 0x8000000000000000;
          auVar50._16_8_ = 0x8000000000000000;
          auVar50._24_8_ = 0x8000000000000000;
          auVar48 = auVar48 ^ auVar50;
          auVar42 = vpcmpeqd_avx2(auVar42,auVar42);
          auVar51._8_8_ = 0x10;
          auVar51._0_8_ = 0x10;
          auVar51._16_8_ = 0x10;
          auVar51._24_8_ = 0x10;
          do {
            auVar45 = vpcmpgtq_avx(auVar49 ^ auVar6._0_16_,auVar43);
            auVar45 = vpackssdw_avx(auVar45,auVar45);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar40,auVar45 ^ auVar40);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            uVar19 = (unsigned_short)uVar36;
            if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36] = uVar19;
            }
            auVar45 = vpcmpgtq_avx(auVar49 ^ auVar6._0_16_,auVar43);
            auVar45 = vpackssdw_avx(auVar45,auVar45);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar40,auVar45 ^ auVar40);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            if ((auVar45 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 1] = uVar19 + 1;
            }
            auVar3 = vpcmpgtq_avx2(auVar50 ^ auVar6,auVar48);
            auVar7 = vpshuflw_avx2(auVar3,0xe8);
            auVar45._0_4_ = auVar7._16_4_;
            auVar45._4_4_ = auVar45._0_4_;
            auVar45._8_4_ = auVar45._0_4_;
            auVar45._12_4_ = auVar45._0_4_;
            auVar45 = vpackssdw_avx(auVar45 ^ auVar40,auVar45 ^ auVar40);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            if ((auVar45 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 2] = uVar19 + 2;
            }
            auVar45 = vpackssdw_avx(auVar3._16_16_,auVar3._16_16_);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar40,auVar45 ^ auVar40);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            if ((auVar45 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 3] = uVar19 + 3;
            }
            auVar45 = vpcmpgtq_avx(auVar49 ^ auVar5._0_16_,auVar47 ^ auVar49);
            auVar45 = vpackssdw_avx(auVar45,auVar45);
            auVar3 = vpermq_avx2(ZEXT1632(auVar45 ^ auVar40),0x55);
            auVar3 = vpackssdw_avx2(auVar3,auVar41);
            auVar45 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 4] = uVar19 + 4;
            }
            auVar45 = vpcmpgtq_avx(auVar49 ^ auVar5._0_16_,auVar47 ^ auVar49);
            auVar45 = vpshufhw_avx(auVar45,0x84);
            auVar3 = vpermq_avx2(ZEXT1632(auVar45 ^ auVar40),0x55);
            auVar3 = vpackssdw_avx2(auVar3,auVar41);
            auVar45 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar45 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 5] = uVar19 + 5;
            }
            auVar7 = vpcmpgtq_avx2(auVar50 ^ auVar5,auVar48);
            auVar3 = vpackssdw_avx2(auVar41,auVar7);
            auVar3 = vpackssdw_avx2(auVar3 ^ auVar42,auVar41);
            auVar45 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar45 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 6] = uVar19 + 6;
            }
            auVar3 = vpackssdw_avx2(auVar41,auVar7);
            auVar3 = vpackssdw_avx2(auVar3 ^ auVar42,auVar41);
            auVar45 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar45 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 7] = uVar19 + 7;
            }
            auVar45 = vpcmpgtq_avx(auVar49 ^ auVar4._0_16_,auVar47 ^ auVar49);
            auVar45 = vpackssdw_avx(auVar45,auVar45);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar40,auVar45 ^ auVar40);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            if ((auVar45 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 8] = uVar19 + 8;
            }
            auVar45 = vpcmpgtq_avx(auVar49 ^ auVar4._0_16_,auVar47 ^ auVar49);
            auVar45 = vpackssdw_avx(auVar45,auVar45);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar40,auVar45 ^ auVar40);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            if ((auVar45 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 9] = uVar19 + 9;
            }
            auVar3 = vpcmpgtq_avx2(auVar50 ^ auVar4,auVar48);
            auVar7 = vpshuflw_avx2(auVar3,0xe8);
            auVar46._0_4_ = auVar7._16_4_;
            auVar46._4_4_ = auVar46._0_4_;
            auVar46._8_4_ = auVar46._0_4_;
            auVar46._12_4_ = auVar46._0_4_;
            auVar45 = vpackssdw_avx(auVar46 ^ auVar40,auVar46 ^ auVar40);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            if ((auVar45 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 10] = uVar19 + 10;
            }
            auVar45 = vpackssdw_avx(auVar3._16_16_,auVar3._16_16_);
            auVar45 = vpackssdw_avx(auVar45 ^ auVar40,auVar45 ^ auVar40);
            auVar45 = vpacksswb_avx(auVar45,auVar45);
            if ((auVar45 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 0xb] = uVar19 + 0xb;
            }
            auVar45 = vpcmpgtq_avx(auVar49 ^ auVar41._0_16_,auVar47 ^ auVar49);
            auVar45 = vpackssdw_avx(auVar45,auVar45);
            auVar3 = vpermq_avx2(ZEXT1632(auVar45 ^ auVar40),0x55);
            auVar3 = vpackssdw_avx2(auVar41,auVar3);
            auVar45 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar45 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 0xc] = uVar19 + 0xc;
            }
            auVar45 = vpcmpgtq_avx(auVar49 ^ auVar41._0_16_,auVar47 ^ auVar49);
            auVar45 = vpshufhw_avx(auVar45,0x84);
            auVar3 = vpermq_avx2(ZEXT1632(auVar45 ^ auVar40),0x55);
            auVar3 = vpackssdw_avx2(auVar41,auVar3);
            auVar45 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar45 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 0xd] = uVar19 + 0xd;
            }
            auVar7 = vpcmpgtq_avx2(auVar50 ^ auVar41,auVar48);
            auVar3 = vpackssdw_avx2(auVar41,auVar7);
            auVar3 = vpackssdw_avx2(auVar41,auVar3 ^ auVar42);
            auVar45 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar45 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 0xe] = uVar19 + 0xe;
            }
            auVar3 = vpackssdw_avx2(auVar41,auVar7);
            auVar3 = vpackssdw_avx2(auVar41,auVar3 ^ auVar42);
            auVar45 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar45 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar13[uVar36 + 0xf] = uVar19 + 0xf;
            }
            uVar36 = uVar36 + 0x10;
            auVar6 = vpaddq_avx2(auVar51,auVar6);
            auVar5 = vpaddq_avx2(auVar51,auVar5);
            auVar4 = vpaddq_avx2(auVar51,auVar4);
            auVar41 = vpaddq_avx2(auVar51,auVar41);
          } while ((uVar26 + 0xf & 0xfffffffffffffff0) != uVar36);
          auVar41 = ZEXT1632(auVar40);
          memset(__s_01,0xff,0x40c);
          auVar4 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
          auVar5 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
          auVar6 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar42 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          uVar36 = 0;
          auVar40 = vpcmpeqd_avx(auVar43,auVar43);
          auVar41 = vpcmpeqd_avx2(auVar41,auVar41);
          do {
            auVar43 = vpcmpgtq_avx(auVar49 ^ auVar42._0_16_,auVar47 ^ auVar49);
            auVar43 = vpackssdw_avx(auVar43,auVar43);
            auVar43 = vpackssdw_avx(auVar43 ^ auVar40,auVar43 ^ auVar40);
            auVar43 = vpacksswb_avx(auVar43,auVar43);
            uVar19 = (unsigned_short)uVar36;
            if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36] = uVar19;
            }
            auVar43 = vpcmpgtq_avx(auVar49 ^ auVar42._0_16_,auVar47 ^ auVar49);
            auVar43 = vpackssdw_avx(auVar43,auVar43);
            auVar43 = vpackssdw_avx(auVar43 ^ auVar40,auVar43 ^ auVar40);
            auVar43 = vpacksswb_avx(auVar43,auVar43);
            if ((auVar43 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 1] = uVar19 + 1;
            }
            auVar3 = vpcmpgtq_avx2(auVar50 ^ auVar42,auVar48);
            auVar7 = vpshuflw_avx2(auVar3,0xe8);
            auVar43._0_4_ = auVar7._16_4_;
            auVar43._4_4_ = auVar43._0_4_;
            auVar43._8_4_ = auVar43._0_4_;
            auVar43._12_4_ = auVar43._0_4_;
            auVar43 = vpackssdw_avx(auVar43 ^ auVar40,auVar43 ^ auVar40);
            auVar43 = vpacksswb_avx(auVar43,auVar43);
            if ((auVar43 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 2] = uVar19 + 2;
            }
            auVar43 = vpackssdw_avx(auVar3._16_16_,auVar3._16_16_);
            auVar43 = vpackssdw_avx(auVar43 ^ auVar40,auVar43 ^ auVar40);
            auVar43 = vpacksswb_avx(auVar43,auVar43);
            if ((auVar43 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 3] = uVar19 + 3;
            }
            auVar43 = vpcmpgtq_avx(auVar49 ^ auVar6._0_16_,auVar47 ^ auVar49);
            auVar43 = vpackssdw_avx(auVar43,auVar43);
            auVar3 = vpermq_avx2(ZEXT1632(auVar43 ^ auVar40),0x55);
            auVar3 = vpackssdw_avx2(auVar3,auVar4);
            auVar43 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 4] = uVar19 + 4;
            }
            auVar43 = vpcmpgtq_avx(auVar49 ^ auVar6._0_16_,auVar47 ^ auVar49);
            auVar43 = vpshufhw_avx(auVar43,0x84);
            auVar3 = vpermq_avx2(ZEXT1632(auVar43 ^ auVar40),0x55);
            auVar3 = vpackssdw_avx2(auVar3,auVar4);
            auVar43 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar43 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 5] = uVar19 + 5;
            }
            auVar7 = vpcmpgtq_avx2(auVar50 ^ auVar6,auVar48);
            auVar3 = vpackssdw_avx2(auVar4,auVar7);
            auVar3 = vpackssdw_avx2(auVar3 ^ auVar41,auVar4);
            auVar43 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar43 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 6] = uVar19 + 6;
            }
            auVar3 = vpackssdw_avx2(auVar4,auVar7);
            auVar3 = vpackssdw_avx2(auVar3 ^ auVar41,auVar4);
            auVar43 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar43 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 7] = uVar19 + 7;
            }
            auVar43 = vpcmpgtq_avx(auVar49 ^ auVar5._0_16_,auVar47 ^ auVar49);
            auVar43 = vpackssdw_avx(auVar43,auVar43);
            auVar43 = vpackssdw_avx(auVar43 ^ auVar40,auVar43 ^ auVar40);
            auVar43 = vpacksswb_avx(auVar43,auVar43);
            if ((auVar43 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 8] = uVar19 + 8;
            }
            auVar43 = vpcmpgtq_avx(auVar49 ^ auVar5._0_16_,auVar47 ^ auVar49);
            auVar43 = vpackssdw_avx(auVar43,auVar43);
            auVar43 = vpackssdw_avx(auVar43 ^ auVar40,auVar43 ^ auVar40);
            auVar43 = vpacksswb_avx(auVar43,auVar43);
            if ((auVar43 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 9] = uVar19 + 9;
            }
            auVar3 = vpcmpgtq_avx2(auVar50 ^ auVar5,auVar48);
            auVar7 = vpshuflw_avx2(auVar3,0xe8);
            auVar44._0_4_ = auVar7._16_4_;
            auVar44._4_4_ = auVar44._0_4_;
            auVar44._8_4_ = auVar44._0_4_;
            auVar44._12_4_ = auVar44._0_4_;
            auVar43 = vpackssdw_avx(auVar44 ^ auVar40,auVar44 ^ auVar40);
            auVar43 = vpacksswb_avx(auVar43,auVar43);
            if ((auVar43 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 10] = uVar19 + 10;
            }
            auVar43 = vpackssdw_avx(auVar3._16_16_,auVar3._16_16_);
            auVar43 = vpackssdw_avx(auVar43 ^ auVar40,auVar43 ^ auVar40);
            auVar43 = vpacksswb_avx(auVar43,auVar43);
            if ((auVar43 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 0xb] = uVar19 + 0xb;
            }
            auVar43 = vpcmpgtq_avx(auVar49 ^ auVar4._0_16_,auVar47 ^ auVar49);
            auVar43 = vpackssdw_avx(auVar43,auVar43);
            auVar3 = vpermq_avx2(ZEXT1632(auVar43 ^ auVar40),0x55);
            auVar3 = vpackssdw_avx2(auVar4,auVar3);
            auVar43 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar43 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 0xc] = uVar19 + 0xc;
            }
            auVar43 = vpcmpgtq_avx(auVar49 ^ auVar4._0_16_,auVar47 ^ auVar49);
            auVar43 = vpshufhw_avx(auVar43,0x84);
            auVar3 = vpermq_avx2(ZEXT1632(auVar43 ^ auVar40),0x55);
            auVar3 = vpackssdw_avx2(auVar4,auVar3);
            auVar43 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar43 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 0xd] = uVar19 + 0xd;
            }
            auVar7 = vpcmpgtq_avx2(auVar50 ^ auVar4,auVar48);
            auVar3 = vpackssdw_avx2(auVar4,auVar7);
            auVar3 = vpackssdw_avx2(auVar4,auVar3 ^ auVar41);
            auVar43 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar43 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 0xe] = uVar19 + 0xe;
            }
            auVar3 = vpackssdw_avx2(auVar4,auVar7);
            auVar3 = vpackssdw_avx2(auVar4,auVar3 ^ auVar41);
            auVar43 = vpacksswb_avx(auVar3._16_16_,auVar3._16_16_);
            if ((auVar43 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar15[uVar36 + 0xf] = uVar19 + 0xf;
            }
            uVar36 = uVar36 + 0x10;
            auVar42 = vpaddq_avx2(auVar51,auVar42);
            auVar6 = vpaddq_avx2(auVar51,auVar6);
            auVar5 = vpaddq_avx2(auVar51,auVar5);
            auVar4 = vpaddq_avx2(auVar51,auVar4);
          } while ((uVar26 + 0xf & 0x1fffffff0) != uVar36);
        }
        uVar12 = 0;
        bVar8 = true;
      }
    }
    if (bVar8) {
      if (uVar38 == 0) {
        uVar12 = 0;
      }
      else {
        lVar27 = 0;
        uVar12 = 0;
        uVar36 = 0;
        puVar16 = in;
        uVar26 = sVar32;
        do {
          uVar22 = uVar26;
          if (insize < uVar26) {
            uVar22 = insize;
          }
          uVar37 = uVar36 * sVar32;
          uVar20 = sVar32 + uVar37;
          if (insize <= sVar32 + uVar37) {
            uVar20 = insize;
          }
          uVar25 = (uint)(uVar36 == uVar38 - 1);
          if (settings->btype == 2) {
            lz77_encoded.data = (uint *)0x0;
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            local_128._0_8_ = (uint *)0x0;
            local_128._8_8_ = (uint *)0x0;
            local_128._24_16_ = (undefined1  [16])0x0;
            puVar17 = (uint *)malloc(0x478);
            puVar18 = (uint *)malloc(0x78);
            frequencies = (uint *)malloc(0x4c);
            if ((puVar18 == (uint *)0x0 || puVar17 == (uint *)0x0) || frequencies == (uint *)0x0) {
LAB_001288d3:
              uVar12 = 0x53;
              __ptr = (void *)0x0;
              __dest = (void *)0x0;
            }
            else {
              memset(puVar17,0,0x478);
              puVar18[0] = 0;
              puVar18[1] = 0;
              puVar18[2] = 0;
              puVar18[3] = 0;
              puVar18[4] = 0;
              puVar18[5] = 0;
              puVar18[6] = 0;
              puVar18[7] = 0;
              puVar18[8] = 0;
              puVar18[9] = 0;
              puVar18[10] = 0;
              puVar18[0xb] = 0;
              puVar18[0xc] = 0;
              puVar18[0xd] = 0;
              puVar18[0xe] = 0;
              puVar18[0xf] = 0;
              puVar18[0x10] = 0;
              puVar18[0x11] = 0;
              puVar18[0x12] = 0;
              puVar18[0x13] = 0;
              puVar18[0x14] = 0;
              puVar18[0x15] = 0;
              puVar18[0x16] = 0;
              puVar18[0x17] = 0;
              puVar18[0x16] = 0;
              puVar18[0x17] = 0;
              puVar18[0x18] = 0;
              puVar18[0x19] = 0;
              puVar18[0x1a] = 0;
              puVar18[0x1b] = 0;
              puVar18[0x1c] = 0;
              puVar18[0x1d] = 0;
              frequencies[0xb] = 0;
              frequencies[0xc] = 0;
              frequencies[0xd] = 0;
              frequencies[0xe] = 0;
              frequencies[0xf] = 0;
              frequencies[0x10] = 0;
              frequencies[0x11] = 0;
              frequencies[0x12] = 0;
              frequencies[8] = 0;
              frequencies[9] = 0;
              frequencies[10] = 0;
              frequencies[0xb] = 0;
              frequencies[0xc] = 0;
              frequencies[0xd] = 0;
              frequencies[0xe] = 0;
              frequencies[0xf] = 0;
              frequencies[0] = 0;
              frequencies[1] = 0;
              frequencies[2] = 0;
              frequencies[3] = 0;
              frequencies[4] = 0;
              frequencies[5] = 0;
              frequencies[6] = 0;
              frequencies[7] = 0;
              if (settings->use_lz77 == 0) {
                sVar34 = uVar20 - uVar37;
                uVar21 = sVar34 * 4;
                puVar39 = lz77_encoded.data;
                if (lz77_encoded.allocsize <= uVar21 && uVar21 - lz77_encoded.allocsize != 0) {
                  sVar28 = (lz77_encoded.allocsize >> 1) + uVar21;
                  puVar39 = (uint *)realloc(lz77_encoded.data,sVar28);
                  lz77_encoded.allocsize = sVar28;
                  if (puVar39 == (uint *)0x0) goto LAB_001288d3;
                }
                lz77_encoded.data = puVar39;
                lz77_encoded.size = sVar34;
                if (uVar37 < uVar20) {
                  lVar35 = 0;
                  do {
                    lz77_encoded.data[lVar35] = (uint)puVar16[lVar35];
                    lVar35 = lVar35 + 1;
                  } while (uVar22 + lVar27 != lVar35);
                }
              }
              else {
                uVar12 = encodeLZ77(&lz77_encoded,&hash,in,uVar37,uVar20,settings->windowsize,
                                    settings->minmatch,settings->nicematch,settings->lazymatching);
                if (uVar12 != 0) {
                  __ptr = (void *)0x0;
                  __dest = (void *)0x0;
                  goto LAB_001289f4;
                }
              }
              if (lz77_encoded.size != 0) {
                sVar34 = 0;
                do {
                  uVar12 = lz77_encoded.data[sVar34];
                  puVar17[uVar12] = puVar17[uVar12] + 1;
                  if (0x100 < (ulong)uVar12) {
                    puVar18[lz77_encoded.data[sVar34 + 2]] =
                         puVar18[lz77_encoded.data[sVar34 + 2]] + 1;
                    sVar34 = sVar34 + 3;
                  }
                  sVar34 = sVar34 + 1;
                } while (sVar34 != lz77_encoded.size);
              }
              puVar17[0x100] = 1;
              uVar12 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar17,0x101,0x11e,0xf);
              if ((uVar12 == 0) &&
                 (uVar12 = HuffmanTree_makeFromFrequencies(&tree_d,puVar18,2,0x1e,0xf),
                 uVar11 = tree_d.numcodes, uVar30 = tree_ll.numcodes, uVar12 == 0)) {
                uVar22 = 0x11e;
                if (tree_ll.numcodes < 0x11e) {
                  uVar22 = (ulong)tree_ll.numcodes;
                }
                uVar20 = 0x1e;
                if (tree_d.numcodes < 0x1e) {
                  uVar20 = (ulong)tree_d.numcodes;
                }
                uVar37 = uVar20 + uVar22;
                uVar21 = (ulong)(uint)((int)uVar37 * 4);
                __dest = malloc(uVar21);
                __ptr = malloc(uVar21);
                if (__ptr == (void *)0x0 || __dest == (void *)0x0) {
                  uVar12 = 0x53;
                }
                else {
                  if (uVar30 != 0) {
                    memcpy(__dest,tree_ll.lengths,uVar22 * 4);
                  }
                  if (uVar11 != 0) {
                    memcpy((void *)((long)__dest + uVar22 * 4),tree_d.lengths,uVar20 * 4);
                  }
                  if (uVar37 == 0) {
                    lVar35 = 0;
                  }
                  else {
                    uVar21 = 0;
                    lVar24 = 0;
                    do {
                      uVar1 = uVar21 + 1;
                      uVar23 = 0;
                      if (uVar1 < uVar37) {
                        uVar23 = 0;
                        uVar31 = uVar1;
                        do {
                          if (*(int *)((long)__dest + uVar31 * 4) !=
                              *(int *)((long)__dest + uVar21 * 4)) break;
                          uVar23 = (ulong)((int)uVar23 + 1);
                          uVar31 = uVar1 + uVar23;
                        } while (uVar31 < uVar37);
                      }
                      iVar2 = *(int *)((long)__dest + uVar21 * 4);
                      uVar12 = (uint)uVar23;
                      if ((uVar12 < 2) || (iVar2 != 0)) {
                        if (2 < uVar12) {
                          *(int *)((long)__ptr + lVar24 * 4) = iVar2;
                          lVar35 = lVar24 + 1;
                          if (5 < uVar12) {
                            lVar29 = (long)__ptr + lVar24 * 4 + 8;
                            lVar33 = 0;
                            do {
                              *(undefined8 *)(lVar29 + -4) = 0x300000010;
                              lVar29 = lVar29 + 8;
                              lVar33 = lVar33 + -2;
                            } while ((ulong)(uint)((int)(uVar23 / 6) * 2) + lVar33 != 0);
                            lVar35 = lVar35 - lVar33;
                            lVar24 = lVar24 - lVar33;
                          }
                          uVar30 = uVar12 + (int)(uVar23 / 6) * -6;
                          if (uVar30 < 3) {
                            uVar12 = uVar12 - uVar30;
                          }
                          else {
                            *(undefined4 *)((long)__ptr + lVar35 * 4) = 0x10;
                            *(uint *)((long)__ptr + lVar24 * 4 + 8) = uVar30 - 3;
                            lVar35 = lVar24 + 3;
                          }
                          goto LAB_00128db1;
                        }
                        *(int *)((long)__ptr + lVar24 * 4) = iVar2;
                        lVar35 = lVar24 + 1;
                      }
                      else {
                        uVar30 = uVar12 + 1;
                        if (uVar30 < 0xb) {
                          *(undefined4 *)((long)__ptr + lVar24 * 4) = 0x11;
                          *(uint *)((long)__ptr + lVar24 * 4 + 4) = uVar12 - 2;
                        }
                        else {
                          if (0x89 < uVar30) {
                            uVar30 = 0x8a;
                          }
                          *(undefined4 *)((long)__ptr + lVar24 * 4) = 0x12;
                          *(uint *)((long)__ptr + lVar24 * 4 + 4) = uVar30 - 0xb;
                          uVar12 = uVar30 - 1;
                        }
                        lVar35 = lVar24 + 2;
LAB_00128db1:
                        uVar21 = uVar21 + uVar12;
                      }
                      uVar21 = uVar21 + 1;
                      lVar24 = lVar35;
                    } while (uVar21 != uVar37);
                  }
                  if (lVar35 != 0) {
                    lVar24 = 0;
                    do {
                      uVar37 = (ulong)*(uint *)((long)__ptr + lVar24 * 4);
                      frequencies[uVar37] = frequencies[uVar37] + 1;
                      lVar24 = (lVar24 - (ulong)(uVar37 < 0x10)) + 2;
                    } while (lVar24 != lVar35);
                  }
                  uVar12 = HuffmanTree_makeFromFrequencies
                                     ((HuffmanTree *)local_128,frequencies,0x13,0x13,7);
                  uVar10 = local_128._8_8_;
                  if (uVar12 == 0) {
                    uVar37 = 0x14;
                    lVar24 = 0x13;
                    do {
                      lVar29 = lVar24;
                      uVar21 = uVar37 - 1;
                      if (uVar21 < 5) {
                        uVar21 = 4;
                        break;
                      }
                      lVar33 = uVar37 * 4;
                      uVar37 = uVar21;
                      lVar24 = lVar29 + -1;
                    } while (*(uint *)(local_128._8_8_ +
                                      (ulong)*(uint *)(&UNK_001e1038 + lVar33) * 4) == 0);
                    writeBits(&local_1f8,uVar25,1);
                    writeBits(&local_1f8,0,1);
                    writeBits(&local_1f8,1,1);
                    writeBits(&local_1f8,(int)uVar22 - 0x101,5);
                    writeBits(&local_1f8,(int)uVar20 - 1,5);
                    writeBits(&local_1f8,(int)uVar21 - 4,4);
                    puVar39 = CLCL_ORDER;
                    do {
                      writeBits(&local_1f8,*(uint *)(uVar10 + (ulong)*puVar39 * 4),3);
                      uVar9 = local_128._0_8_;
                      puVar39 = puVar39 + 1;
                      lVar29 = lVar29 + -1;
                    } while (lVar29 != 0);
                    if (lVar35 != 0) {
                      lVar24 = 0;
                      do {
                        uVar25 = *(uint *)((long)__ptr + lVar24 * 4);
                        writeBitsReversed(&local_1f8,*(uint *)(uVar9 + (ulong)uVar25 * 4),
                                          (ulong)*(uint *)(uVar10 + (ulong)uVar25 * 4));
                        if (uVar25 - 0x10 < 3) {
                          lVar29 = lVar24 * 4;
                          lVar24 = lVar24 + 1;
                          writeBits(&local_1f8,*(uint *)((long)__ptr + lVar29 + 4),
                                    *(size_t *)(&DAT_001e1110 + (ulong)(uVar25 - 0x10) * 8));
                        }
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != lVar35);
                    }
                    writeLZ77data(&local_1f8,&lz77_encoded,&tree_ll,&tree_d);
                    if ((ulong)tree_ll.lengths[0x100] == 0) {
                      uVar12 = 0x40;
                    }
                    else {
                      writeBitsReversed(&local_1f8,tree_ll.codes[0x100],
                                        (ulong)tree_ll.lengths[0x100]);
                      uVar12 = 0;
                    }
                  }
                }
              }
              else {
                __ptr = (void *)0x0;
                __dest = (void *)0x0;
              }
            }
LAB_001289f4:
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            free(lz77_encoded.data);
            lz77_encoded.data = (uint *)0x0;
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            HuffmanTree_cleanup((HuffmanTree *)local_128);
            free(puVar17);
            free(puVar18);
            free(frequencies);
            free(__dest);
            free(__ptr);
          }
          else if (settings->btype == 1) {
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            uVar12 = generateFixedLitLenTree(&tree_ll);
            if (uVar12 == 0) {
              uVar12 = generateFixedDistanceTree(&tree_d);
            }
            if (uVar12 == 0) {
              writeBits(&local_1f8,uVar25,1);
              writeBits(&local_1f8,1,1);
              writeBits(&local_1f8,0,1);
              if (settings->use_lz77 == 0) {
                uVar12 = 0;
                if (uVar37 < uVar20) {
                  puVar17 = tree_ll.codes;
                  puVar18 = tree_ll.lengths;
                  lVar35 = 0;
                  do {
                    writeBitsReversed(&local_1f8,puVar17[puVar16[lVar35]],
                                      (ulong)puVar18[puVar16[lVar35]]);
                    lVar35 = lVar35 + 1;
                  } while (uVar22 + lVar27 != lVar35);
                  uVar12 = 0;
                }
              }
              else {
                local_128._0_8_ = (uint *)0x0;
                local_128._8_8_ = (uint *)0x0;
                local_128._16_8_ = 0;
                uVar12 = encodeLZ77((uivector *)local_128,&hash,in,uVar37,uVar20,
                                    settings->windowsize,settings->minmatch,settings->nicematch,
                                    settings->lazymatching);
                if (uVar12 == 0) {
                  writeLZ77data(&local_1f8,(uivector *)local_128,&tree_ll,&tree_d);
                }
                local_128._8_8_ = (uint *)0x0;
                local_128._16_8_ = 0;
                free((void *)local_128._0_8_);
              }
              if (uVar12 == 0) {
                writeBitsReversed(&local_1f8,tree_ll.codes[0x100],(ulong)tree_ll.lengths[0x100]);
                uVar12 = 0;
              }
            }
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
          }
          uVar36 = uVar36 + 1;
          if (uVar36 == uVar38) break;
          uVar26 = uVar26 + sVar32;
          lVar27 = lVar27 - sVar32;
          puVar16 = puVar16 + sVar32;
        } while (uVar12 == 0);
      }
    }
    free(hash.head);
    free(hash.val);
    free(hash.chain);
    free(hash.zeros);
    free(hash.headz);
    free(hash.chainz);
  }
LAB_001290c0:
  *out = v.data;
  *outsize = v.size;
  return uVar12;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
  const unsigned char* in, size_t insize,
  const LodePNGCompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}